

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000031d150 = 0x2d2d2d2d2d2d2d;
    uRam000000000031d157._0_1_ = '-';
    uRam000000000031d157._1_1_ = '-';
    uRam000000000031d157._2_1_ = '-';
    uRam000000000031d157._3_1_ = '-';
    uRam000000000031d157._4_1_ = '-';
    uRam000000000031d157._5_1_ = '-';
    uRam000000000031d157._6_1_ = '-';
    uRam000000000031d157._7_1_ = '-';
    DAT_0031d140 = '-';
    DAT_0031d140_1._0_1_ = '-';
    DAT_0031d140_1._1_1_ = '-';
    DAT_0031d140_1._2_1_ = '-';
    DAT_0031d140_1._3_1_ = '-';
    DAT_0031d140_1._4_1_ = '-';
    DAT_0031d140_1._5_1_ = '-';
    DAT_0031d140_1._6_1_ = '-';
    uRam000000000031d148 = 0x2d2d2d2d2d2d2d;
    DAT_0031d14f = 0x2d;
    DAT_0031d130 = '-';
    DAT_0031d130_1._0_1_ = '-';
    DAT_0031d130_1._1_1_ = '-';
    DAT_0031d130_1._2_1_ = '-';
    DAT_0031d130_1._3_1_ = '-';
    DAT_0031d130_1._4_1_ = '-';
    DAT_0031d130_1._5_1_ = '-';
    DAT_0031d130_1._6_1_ = '-';
    uRam000000000031d138._0_1_ = '-';
    uRam000000000031d138._1_1_ = '-';
    uRam000000000031d138._2_1_ = '-';
    uRam000000000031d138._3_1_ = '-';
    uRam000000000031d138._4_1_ = '-';
    uRam000000000031d138._5_1_ = '-';
    uRam000000000031d138._6_1_ = '-';
    uRam000000000031d138._7_1_ = '-';
    DAT_0031d120 = '-';
    DAT_0031d120_1._0_1_ = '-';
    DAT_0031d120_1._1_1_ = '-';
    DAT_0031d120_1._2_1_ = '-';
    DAT_0031d120_1._3_1_ = '-';
    DAT_0031d120_1._4_1_ = '-';
    DAT_0031d120_1._5_1_ = '-';
    DAT_0031d120_1._6_1_ = '-';
    uRam000000000031d128._0_1_ = '-';
    uRam000000000031d128._1_1_ = '-';
    uRam000000000031d128._2_1_ = '-';
    uRam000000000031d128._3_1_ = '-';
    uRam000000000031d128._4_1_ = '-';
    uRam000000000031d128._5_1_ = '-';
    uRam000000000031d128._6_1_ = '-';
    uRam000000000031d128._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000031d118._0_1_ = '-';
    uRam000000000031d118._1_1_ = '-';
    uRam000000000031d118._2_1_ = '-';
    uRam000000000031d118._3_1_ = '-';
    uRam000000000031d118._4_1_ = '-';
    uRam000000000031d118._5_1_ = '-';
    uRam000000000031d118._6_1_ = '-';
    uRam000000000031d118._7_1_ = '-';
    DAT_0031d15f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}